

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_atomics_op(JSContext *ctx,JSValue this_obj,int argc,JSValue *argv,int op)

{
  JSValue val;
  JSValue val_00;
  JSValue idx_val;
  long lVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  uint uVar7;
  uint *puVar8;
  JSContext *in_RDI;
  long in_R8;
  uint in_R9D;
  bool bVar9;
  JSValue JVar10;
  uint32_t v1_2;
  uint16_t v1_1;
  uint8_t v1;
  uint32_t v32;
  JSArrayBuffer *abuf;
  JSClassID class_id;
  JSValue ret;
  void *ptr;
  uint32_t rep_val;
  uint32_t a;
  uint32_t v;
  int size_log2;
  JSValue v_1;
  uint32_t *pres;
  JSContext *ctx_00;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffffd8c;
  int64_t in_stack_fffffffffffffd90;
  uint local_240;
  ushort local_22c;
  byte local_21d;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  undefined4 in_stack_fffffffffffffdf8;
  undefined2 in_stack_fffffffffffffdfc;
  undefined2 in_stack_fffffffffffffdfe;
  JSArrayBuffer **in_stack_fffffffffffffe00;
  undefined2 in_stack_fffffffffffffe08;
  undefined2 in_stack_fffffffffffffe0a;
  undefined2 in_stack_fffffffffffffe0c;
  undefined1 in_stack_fffffffffffffe0e;
  undefined1 in_stack_fffffffffffffe0f;
  undefined8 in_stack_fffffffffffffe10;
  undefined2 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1a;
  undefined1 in_stack_fffffffffffffe1b;
  undefined4 in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe30;
  undefined2 in_stack_fffffffffffffe34;
  undefined2 in_stack_fffffffffffffe36;
  int64_t in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe40;
  ushort local_1bc;
  byte local_1a9;
  uint local_174;
  ushort local_16a;
  byte local_165;
  uint local_fc;
  long local_f8;
  undefined4 local_ec;
  JSValueUnion local_e8;
  int64_t local_e0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  int local_c0;
  JSValueUnion local_90;
  int64_t local_88;
  undefined4 uStack_6c;
  JSValueUnion local_60;
  int64_t local_58;
  JSValueUnion local_30;
  int64_t local_28;
  undefined4 uStack_c;
  
  pres = *(uint32_t **)(in_R8 + 0x10);
  ctx_00 = *(JSContext **)(in_R8 + 0x18);
  uVar11 = 0;
  JVar10.tag._0_2_ = in_stack_fffffffffffffe18;
  JVar10.u = (JSValueUnion)in_stack_fffffffffffffe10;
  JVar10.tag._2_1_ = in_stack_fffffffffffffe1a;
  JVar10.tag._3_1_ = in_stack_fffffffffffffe1b;
  JVar10.tag._4_4_ = in_stack_fffffffffffffe1c;
  idx_val.u._4_2_ = in_stack_fffffffffffffe34;
  idx_val.u.int32 = in_stack_fffffffffffffe30;
  idx_val.u._6_2_ = in_stack_fffffffffffffe36;
  idx_val.tag = in_stack_fffffffffffffe38;
  puVar8 = (uint *)js_atomics_get_ptr((JSContext *)
                                      CONCAT17(in_stack_fffffffffffffe0f,
                                               CONCAT16(in_stack_fffffffffffffe0e,
                                                        CONCAT24(in_stack_fffffffffffffe0c,
                                                                 CONCAT22(in_stack_fffffffffffffe0a,
                                                                          in_stack_fffffffffffffe08)
                                                                ))),in_stack_fffffffffffffe00,
                                      (int *)CONCAT26(in_stack_fffffffffffffdfe,
                                                      CONCAT24(in_stack_fffffffffffffdfc,
                                                               in_stack_fffffffffffffdf8)),
                                      (JSClassID *)
                                      CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                                      JVar10,idx_val,in_stack_fffffffffffffe40);
  lVar1 = local_90;
  if (puVar8 == (uint *)0x0) {
    local_90.ptr = (void *)(lVar1 << 0x20);
    local_88 = 6;
    return _local_90;
  }
  local_cc = 0;
  if (in_R9D == 7) {
    local_c4 = 0;
  }
  else {
    val.u._4_4_ = in_stack_fffffffffffffd8c;
    val.u.int32 = uVar11;
    val.tag = in_stack_fffffffffffffd90;
    iVar6 = JS_ToUint32(ctx_00,pres,val);
    if (iVar6 != 0) {
      local_90.ptr = (void *)(lVar1 << 0x20);
      local_88 = 6;
      return _local_90;
    }
    local_c4 = local_fc;
    if (in_R9D == 6) {
      val_00.u._4_4_ = in_stack_fffffffffffffd8c;
      val_00.u.int32 = uVar11;
      val_00.tag = in_stack_fffffffffffffd90;
      iVar6 = JS_ToUint32(ctx_00,pres,val_00);
      if (iVar6 != 0) {
        local_90.ptr = (void *)(lVar1 << 0x20);
        local_88 = 6;
        return _local_90;
      }
      local_cc = local_fc;
    }
    if (*(char *)(local_f8 + 4) != '\0') {
      JVar10 = JS_ThrowTypeErrorDetachedArrayBuffer((JSContext *)0x1be082);
      return JVar10;
    }
  }
  local_165 = (byte)local_c4;
  switch(in_R9D | local_c0 << 3) {
  case 0:
    LOCK();
    uVar7 = *puVar8;
    *(byte *)puVar8 = (byte)*puVar8 + local_165;
    UNLOCK();
    local_c8 = (uint)(byte)uVar7;
    break;
  case 1:
    local_1a9 = (byte)*puVar8;
    do {
      LOCK();
      bVar2 = (byte)*puVar8;
      bVar9 = local_1a9 == bVar2;
      if (bVar9) {
        *(byte *)puVar8 = local_1a9 & local_165;
        bVar2 = local_1a9;
      }
      UNLOCK();
      local_1a9 = bVar2;
    } while (!bVar9);
    local_c8 = (uint)bVar2;
    break;
  case 2:
    bVar2 = (byte)*puVar8;
    do {
      LOCK();
      bVar3 = (byte)*puVar8;
      bVar9 = bVar2 == bVar3;
      if (bVar9) {
        *(byte *)puVar8 = bVar2 | local_165;
        bVar3 = bVar2;
      }
      UNLOCK();
      bVar2 = bVar3;
    } while (!bVar9);
    local_c8 = (uint)bVar3;
    break;
  case 3:
    LOCK();
    uVar7 = *puVar8;
    *(byte *)puVar8 = (byte)*puVar8 - local_165;
    UNLOCK();
    local_c8 = (uint)(byte)uVar7;
    break;
  case 4:
    local_21d = (byte)*puVar8;
    do {
      LOCK();
      bVar2 = (byte)*puVar8;
      bVar9 = local_21d == bVar2;
      if (bVar9) {
        *(byte *)puVar8 = local_21d ^ local_165;
        bVar2 = local_21d;
      }
      UNLOCK();
      local_21d = bVar2;
    } while (!bVar9);
    local_c8 = (uint)bVar2;
    break;
  case 5:
    LOCK();
    uVar7 = *puVar8;
    *(byte *)puVar8 = local_165;
    UNLOCK();
    local_c8 = (uint)(byte)uVar7;
    break;
  case 6:
    LOCK();
    bVar2 = (byte)*puVar8;
    bVar9 = local_165 == bVar2;
    if (bVar9) {
      *(byte *)puVar8 = (byte)local_cc;
      bVar2 = local_165;
    }
    UNLOCK();
    if (!bVar9) {
      local_165 = bVar2;
    }
    local_c8 = (uint)local_165;
    break;
  case 7:
    local_c8 = (uint)(byte)*puVar8;
    break;
  case 8:
    LOCK();
    uVar7 = *puVar8;
    *(ushort *)puVar8 = (ushort)*puVar8 + (ushort)local_c4;
    UNLOCK();
    local_c8 = (uint)(ushort)uVar7;
    break;
  case 9:
    local_1bc = (ushort)*puVar8;
    do {
      LOCK();
      uVar4 = (ushort)*puVar8;
      bVar9 = local_1bc == uVar4;
      if (bVar9) {
        *(ushort *)puVar8 = local_1bc & (ushort)local_c4;
        uVar4 = local_1bc;
      }
      UNLOCK();
      local_1bc = uVar4;
    } while (!bVar9);
    local_c8 = (uint)uVar4;
    break;
  case 10:
    uVar4 = (ushort)*puVar8;
    do {
      LOCK();
      uVar5 = (ushort)*puVar8;
      bVar9 = uVar4 == uVar5;
      if (bVar9) {
        *(ushort *)puVar8 = uVar4 | (ushort)local_c4;
        uVar5 = uVar4;
      }
      UNLOCK();
      uVar4 = uVar5;
    } while (!bVar9);
    local_c8 = (uint)uVar5;
    break;
  case 0xb:
    LOCK();
    uVar7 = *puVar8;
    *(ushort *)puVar8 = (ushort)*puVar8 - (ushort)local_c4;
    UNLOCK();
    local_c8 = (uint)(ushort)uVar7;
    break;
  case 0xc:
    local_22c = (ushort)*puVar8;
    do {
      LOCK();
      uVar4 = (ushort)*puVar8;
      bVar9 = local_22c == uVar4;
      if (bVar9) {
        *(ushort *)puVar8 = local_22c ^ (ushort)local_c4;
        uVar4 = local_22c;
      }
      UNLOCK();
      local_22c = uVar4;
    } while (!bVar9);
    local_c8 = (uint)uVar4;
    break;
  case 0xd:
    LOCK();
    uVar7 = *puVar8;
    *(ushort *)puVar8 = (ushort)local_c4;
    UNLOCK();
    local_c8 = (uint)(ushort)uVar7;
    break;
  case 0xe:
    local_16a = (ushort)local_c4;
    LOCK();
    uVar4 = (ushort)*puVar8;
    bVar9 = (ushort)local_c4 == uVar4;
    if (bVar9) {
      *(ushort *)puVar8 = (ushort)local_cc;
      uVar4 = (ushort)local_c4;
    }
    UNLOCK();
    if (!bVar9) {
      local_16a = uVar4;
    }
    local_c8 = (uint)local_16a;
    break;
  case 0xf:
    local_c8 = (uint)(ushort)*puVar8;
    break;
  case 0x10:
    LOCK();
    local_c8 = *puVar8;
    *puVar8 = *puVar8 + local_c4;
    UNLOCK();
    break;
  case 0x11:
    uVar7 = *puVar8;
    do {
      LOCK();
      local_c8 = *puVar8;
      bVar9 = uVar7 == local_c8;
      if (bVar9) {
        *puVar8 = uVar7 & local_c4;
        local_c8 = uVar7;
      }
      UNLOCK();
      uVar7 = local_c8;
    } while (!bVar9);
    break;
  case 0x12:
    uVar7 = *puVar8;
    do {
      LOCK();
      local_c8 = *puVar8;
      bVar9 = uVar7 == local_c8;
      if (bVar9) {
        *puVar8 = uVar7 | local_c4;
        local_c8 = uVar7;
      }
      UNLOCK();
      uVar7 = local_c8;
    } while (!bVar9);
    break;
  case 0x13:
    LOCK();
    local_c8 = *puVar8;
    *puVar8 = *puVar8 - local_c4;
    UNLOCK();
    break;
  case 0x14:
    local_240 = *puVar8;
    do {
      LOCK();
      local_c8 = *puVar8;
      bVar9 = local_240 == local_c8;
      if (bVar9) {
        *puVar8 = local_240 ^ local_c4;
        local_c8 = local_240;
      }
      UNLOCK();
      local_240 = local_c8;
    } while (!bVar9);
    break;
  case 0x15:
    LOCK();
    local_c8 = *puVar8;
    *puVar8 = local_c4;
    UNLOCK();
    break;
  case 0x16:
    local_174 = local_c4;
    LOCK();
    uVar7 = *puVar8;
    bVar9 = local_c4 == uVar7;
    if (bVar9) {
      *puVar8 = local_cc;
      uVar7 = local_c4;
    }
    UNLOCK();
    if (!bVar9) {
      local_174 = uVar7;
    }
    local_c8 = local_174;
    break;
  case 0x17:
    local_c8 = *puVar8;
    break;
  default:
    abort();
  }
  switch(local_ec) {
  case 0x16:
    local_c8 = (uint)(char)local_c8;
    break;
  case 0x17:
    local_c8 = local_c8 & 0xff;
    break;
  case 0x18:
    local_c8 = (uint)(short)local_c8;
    break;
  case 0x19:
    local_c8 = local_c8 & 0xffff;
    break;
  case 0x1a:
    break;
  case 0x1b:
    if (local_c8 < 0x80000000) {
      local_30._4_4_ = uStack_c;
      local_30.int32 = local_c8;
      local_28 = 0;
    }
    else {
      JVar10 = __JS_NewFloat64(in_RDI,(double)local_c8);
      local_60 = JVar10.u;
      local_30 = local_60;
      local_58 = JVar10.tag;
      local_28 = local_58;
    }
    local_e8 = local_30;
    local_e0 = local_28;
    goto LAB_001bebc4;
  default:
    abort();
  }
  local_e8._4_4_ = uStack_6c;
  local_e8.int32 = local_c8;
  local_e0 = 0;
LAB_001bebc4:
  local_88 = local_e0;
  local_90.float64 = local_e8.float64;
  return _local_90;
}

Assistant:

static JSValue js_atomics_op(JSContext *ctx,
                             JSValueConst this_obj,
                             int argc, JSValueConst *argv, int op)
{
    int size_log2;
#ifdef CONFIG_BIGNUM
    uint64_t v, a, rep_val;
#else
    uint32_t v, a, rep_val;
#endif
    void *ptr;
    JSValue ret;
    JSClassID class_id;
    JSArrayBuffer *abuf;

    ptr = js_atomics_get_ptr(ctx, &abuf, &size_log2, &class_id,
                             argv[0], argv[1], 0);
    if (!ptr)
        return JS_EXCEPTION;
    rep_val = 0;
    if (op == ATOMICS_OP_LOAD) {
        v = 0;
    } else {
#ifdef CONFIG_BIGNUM
        if (size_log2 == 3) {
            int64_t v64;
            if (JS_ToBigInt64(ctx, &v64, argv[2]))
                return JS_EXCEPTION;
            v = v64;
            if (op == ATOMICS_OP_COMPARE_EXCHANGE) {
                if (JS_ToBigInt64(ctx, &v64, argv[3]))
                    return JS_EXCEPTION;
                rep_val = v64;
            }
        } else
#endif
        {
                uint32_t v32;
                if (JS_ToUint32(ctx, &v32, argv[2]))
                    return JS_EXCEPTION;
                v = v32;
                if (op == ATOMICS_OP_COMPARE_EXCHANGE) {
                    if (JS_ToUint32(ctx, &v32, argv[3]))
                        return JS_EXCEPTION;
                    rep_val = v32;
                }
        }
        if (abuf->detached)
            return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
   }

   switch(op | (size_log2 << 3)) {
            
#ifdef CONFIG_BIGNUM
#define OP(op_name, func_name)                          \
    case ATOMICS_OP_ ## op_name | (0 << 3):             \
       a = func_name((_Atomic(uint8_t) *)ptr, v);       \
       break;                                           \
    case ATOMICS_OP_ ## op_name | (1 << 3):             \
        a = func_name((_Atomic(uint16_t) *)ptr, v);     \
        break;                                          \
    case ATOMICS_OP_ ## op_name | (2 << 3):             \
        a = func_name((_Atomic(uint32_t) *)ptr, v);     \
        break;                                          \
    case ATOMICS_OP_ ## op_name | (3 << 3):             \
        a = func_name((_Atomic(uint64_t) *)ptr, v);     \
        break;
#else
#define OP(op_name, func_name)                          \
    case ATOMICS_OP_ ## op_name | (0 << 3):             \
       a = func_name((_Atomic(uint8_t) *)ptr, v);       \
       break;                                           \
    case ATOMICS_OP_ ## op_name | (1 << 3):             \
        a = func_name((_Atomic(uint16_t) *)ptr, v);     \
        break;                                          \
    case ATOMICS_OP_ ## op_name | (2 << 3):             \
        a = func_name((_Atomic(uint32_t) *)ptr, v);     \
        break;
#endif
        OP(ADD, atomic_fetch_add)
        OP(AND, atomic_fetch_and)
        OP(OR, atomic_fetch_or)
        OP(SUB, atomic_fetch_sub)
        OP(XOR, atomic_fetch_xor)
        OP(EXCHANGE, atomic_exchange)
#undef OP

    case ATOMICS_OP_LOAD | (0 << 3):
        a = atomic_load((_Atomic(uint8_t) *)ptr);
        break;
    case ATOMICS_OP_LOAD | (1 << 3):
        a = atomic_load((_Atomic(uint16_t) *)ptr);
        break;
    case ATOMICS_OP_LOAD | (2 << 3):
        a = atomic_load((_Atomic(uint32_t) *)ptr);
        break;
#ifdef CONFIG_BIGNUM
    case ATOMICS_OP_LOAD | (3 << 3):
        a = atomic_load((_Atomic(uint64_t) *)ptr);
        break;
#endif
        
    case ATOMICS_OP_COMPARE_EXCHANGE | (0 << 3):
        {
            uint8_t v1 = v;
            atomic_compare_exchange_strong((_Atomic(uint8_t) *)ptr, &v1, rep_val);
            a = v1;
        }
        break;
    case ATOMICS_OP_COMPARE_EXCHANGE | (1 << 3):
        {
            uint16_t v1 = v;
            atomic_compare_exchange_strong((_Atomic(uint16_t) *)ptr, &v1, rep_val);
            a = v1;
        }
        break;
    case ATOMICS_OP_COMPARE_EXCHANGE | (2 << 3):
        {
            uint32_t v1 = v;
            atomic_compare_exchange_strong((_Atomic(uint32_t) *)ptr, &v1, rep_val);
            a = v1;
        }
        break;
#ifdef CONFIG_BIGNUM
    case ATOMICS_OP_COMPARE_EXCHANGE | (3 << 3):
        {
            uint64_t v1 = v;
            atomic_compare_exchange_strong((_Atomic(uint64_t) *)ptr, &v1, rep_val);
            a = v1;
        }
        break;
#endif
    default:
        abort();
    }

    switch(class_id) {
    case JS_CLASS_INT8_ARRAY:
        a = (int8_t)a;
        goto done;
    case JS_CLASS_UINT8_ARRAY:
        a = (uint8_t)a;
        goto done;
    case JS_CLASS_INT16_ARRAY:
        a = (int16_t)a;
        goto done;
    case JS_CLASS_UINT16_ARRAY:
        a = (uint16_t)a;
        goto done;
    case JS_CLASS_INT32_ARRAY:
    done:
        ret = JS_NewInt32(ctx, a);
        break;
    case JS_CLASS_UINT32_ARRAY:
        ret = JS_NewUint32(ctx, a);
        break;
#ifdef CONFIG_BIGNUM
    case JS_CLASS_BIG_INT64_ARRAY:
        ret = JS_NewBigInt64(ctx, a);
        break;
    case JS_CLASS_BIG_UINT64_ARRAY:
        ret = JS_NewBigUint64(ctx, a);
        break;
#endif
    default:
        abort();
    }
    return ret;
}